

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_vprintf(mg_connection *conn,char *fmt,__va_list_tag *ap)

{
  int local_2034;
  char **ppcStack_2030;
  int len;
  char *buf;
  char mem [8192];
  __va_list_tag *ap_local;
  char *fmt_local;
  mg_connection *conn_local;
  
  ppcStack_2030 = (char **)0x0;
  local_2034 = alloc_vprintf((char **)&stack0xffffffffffffdfd0,(char *)&buf,0x2000,fmt,ap);
  if (0 < local_2034) {
    local_2034 = mg_write(conn,ppcStack_2030,(long)local_2034);
  }
  if (ppcStack_2030 != &buf) {
    mg_free(ppcStack_2030);
  }
  return local_2034;
}

Assistant:

static int
mg_vprintf(struct mg_connection *conn, const char *fmt, va_list ap)
{
	char mem[MG_BUF_LEN];
	char *buf = NULL;
	int len;

	if ((len = alloc_vprintf(&buf, mem, sizeof(mem), fmt, ap)) > 0) {
		len = mg_write(conn, buf, (size_t)len);
	}
	if (buf != mem) {
		mg_free(buf);
	}

	return len;
}